

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawrend.cpp
# Opt level: O2

void __thiscall CGL::DrawRend::scroll_event(DrawRend *this,float offset_x,float offset_y)

{
  float zoom;
  
  if ((((offset_x == 0.0) && (!NAN(offset_x))) && (offset_y == 0.0)) && (!NAN(offset_y))) {
    return;
  }
  zoom = (offset_x + offset_y) * 0.05 + 1.0;
  if (zoom <= 0.5) {
    zoom = 0.5;
  }
  if (1.5 <= zoom) {
    zoom = 1.5;
  }
  move_view(this,0.0,0.0,zoom);
  redraw(this);
  return;
}

Assistant:

void DrawRend::scroll_event( float offset_x, float offset_y ) {
  if (offset_x || offset_y) {
    float scale = 1 + 0.05 * (offset_x + offset_y);
    scale = std::min(1.5f,std::max(0.5f,scale));
    move_view(0,0,scale);
    redraw();
  }
}